

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

void fdb_free_cmp_func_list(list *cmp_func_list)

{
  list_elem *plVar1;
  list *in_RDI;
  list_elem *e;
  cmp_func_node *cmp_node;
  list_elem *local_18;
  
  if (in_RDI != (list *)0x0) {
    local_18 = list_begin(in_RDI);
    while (local_18 != (list_elem *)0x0) {
      plVar1 = local_18 + -2;
      local_18 = list_remove(in_RDI,local_18);
      free(plVar1->next);
      free(&plVar1->next);
    }
  }
  return;
}

Assistant:

void fdb_free_cmp_func_list(struct list *cmp_func_list)
{
    if (!cmp_func_list) {
        return;
    }

    struct cmp_func_node *cmp_node;
    struct list_elem *e = list_begin(cmp_func_list);
    while (e) {
        cmp_node = _get_entry(e, struct cmp_func_node, le);
        e = list_remove(cmp_func_list, &cmp_node->le);
        free(cmp_node->kvs_name);
        free(cmp_node);
    }
}